

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

Vec_Int_t * Cba_NtkCollectOutFons(Cba_Ntk_t *p,Vec_Int_t *vObjs)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  void *__s;
  void *__s_00;
  int iVar7;
  uint Entry;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  size_t __size;
  int iVar12;
  size_t local_58;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(400);
  p_00->pArray = piVar6;
  uVar2 = (p->vObjType).nSize;
  iVar12 = (((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0);
  if (iVar12 == 0) {
    __size = 0;
    __s = (void *)0x0;
  }
  else {
    __size = (long)iVar12 << 2;
    __s = malloc(__size);
  }
  local_58 = 0;
  memset(__s,0,__size);
  uVar5 = (p->vFonObj).nSize;
  iVar7 = (((int)uVar5 >> 5) + 1) - (uint)((uVar5 & 0x1f) == 0);
  if (iVar7 == 0) {
    __s_00 = (void *)0x0;
  }
  else {
    local_58 = (long)iVar7 << 2;
    __s_00 = malloc(local_58);
  }
  memset(__s_00,0,local_58);
  iVar3 = vObjs->nSize;
  if (0 < (long)iVar3) {
    piVar6 = vObjs->pArray;
    lVar8 = 0;
    do {
      uVar5 = piVar6[lVar8];
      if (((int)uVar5 < 0) || (iVar12 * 0x20 <= (int)uVar5)) {
LAB_003d88c0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      puVar1 = (uint *)((long)__s + (ulong)(uVar5 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar5 & 0x1f);
      lVar8 = lVar8 + 1;
    } while (iVar3 != lVar8);
  }
  if (1 < (int)uVar2) {
    uVar9 = 1;
    do {
      if (uVar9 == uVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((p->vObjType).pArray[uVar9] != '\0') {
        if ((uint)(iVar12 * 0x20) <= uVar9) {
LAB_003d8882:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if ((*(uint *)((long)__s + (uVar9 >> 5 & 0x7ffffff) * 4) >> ((uint)uVar9 & 0x1f) & 1) == 0)
        {
          lVar8 = (long)(p->vObjFin0).nSize;
          if ((lVar8 <= (long)uVar9) || (lVar8 <= (long)(uVar9 + 1))) goto LAB_003d8863;
          piVar6 = (p->vObjFin0).pArray;
          uVar5 = piVar6[uVar9];
          uVar11 = (ulong)uVar5;
          iVar4 = piVar6[uVar9 + 1];
          uVar10 = uVar5;
          while ((int)uVar10 < iVar4) {
            if ((int)uVar5 < 1) {
              __assert_fail("f>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                            ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
            }
            if ((p->vFinFon).nSize <= (int)uVar11) goto LAB_003d8863;
            uVar10 = (p->vFinFon).pArray[uVar11];
            if (0 < (int)uVar10) {
              if (iVar7 * 0x20 <= (int)uVar10) goto LAB_003d88c0;
              puVar1 = (uint *)((long)__s_00 + (ulong)(uVar10 >> 5) * 4);
              *puVar1 = *puVar1 | 1 << ((byte)uVar10 & 0x1f);
            }
            uVar11 = uVar11 + 1;
            uVar10 = (uint)uVar11;
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar2);
  }
  if (0 < iVar3) {
    lVar8 = 0;
    do {
      uVar2 = vObjs->pArray[lVar8];
      if ((int)uVar2 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      uVar5 = (p->vObjFon0).nSize;
      if (((int)uVar5 <= (int)uVar2) || (uVar5 <= uVar2 + 1)) {
LAB_003d8863:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar10 = (p->vObjFon0).pArray[uVar2];
      Entry = uVar10;
      while ((int)Entry < (p->vObjFon0).pArray[(ulong)uVar2 + 1]) {
        if (((int)uVar10 < 0) || (iVar7 * 0x20 <= (int)Entry)) goto LAB_003d8882;
        if ((*(uint *)((long)__s_00 + (ulong)(Entry >> 5) * 4) >> (Entry & 0x1f) & 1) != 0) {
          Vec_IntPush(p_00,Entry);
          uVar5 = (p->vObjFon0).nSize;
        }
        Entry = Entry + 1;
        if ((int)uVar5 <= (int)(uVar2 + 1)) goto LAB_003d8863;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vObjs->nSize);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Cba_NtkCollectOutFons( Cba_Ntk_t * p, Vec_Int_t * vObjs )
{
    Vec_Int_t * vFons = Vec_IntAlloc( 100 );
    Vec_Bit_t * vMapObjs = Vec_BitStart( Cba_NtkObjNum(p) + 1 );
    Vec_Bit_t * vVisFons = Vec_BitStart( Cba_NtkFonNum(p) + 1 );
    int i, k, iObj, iFin, iFon;
    // map objects
    Vec_IntForEachEntry( vObjs, iObj, i )
        Vec_BitWriteEntry( vMapObjs, iObj, 1 );
    // mark those used by non-objects
    Cba_NtkForEachObj( p, iObj )
        if ( !Vec_BitEntry(vMapObjs, iObj) )
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
                if ( iFon > 0 )
                    Vec_BitWriteEntry( vVisFons, iFon, 1 );
    // collect pointed fons among those in objects
    Vec_IntForEachEntry( vObjs, iObj, i )
        Cba_ObjForEachFon( p, iObj, iFon, k )
            if ( Vec_BitEntry(vVisFons, iFon) )
                Vec_IntPush( vFons, iFon );
    Vec_BitFree( vMapObjs );
    Vec_BitFree( vVisFons );
    return vFons;
}